

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

arg_t * SEM_VarList(ast *node,field_t **f)

{
  arg_t *paVar1;
  ast *paVar2;
  ast *node_00;
  attr *a;
  field_t *pfVar3;
  field_t *pfVar4;
  arg_t *paVar5;
  field_t **ppfVar6;
  
  paVar1 = (arg_t *)malloc(0x10);
  paVar2 = child(node,1);
  node_00 = child(paVar2,1);
  a = SEM_Specifier(node_00);
  pfVar4 = *f;
  ppfVar6 = f;
  if (*f != (field_t *)0x0) {
    do {
      pfVar3 = pfVar4;
      pfVar4 = pfVar3->next;
    } while (pfVar4 != (field_t *)0x0);
    ppfVar6 = &pfVar3->next;
  }
  paVar2 = child(paVar2,2);
  paVar5 = (arg_t *)0x0;
  pfVar4 = SEM_VarDec(paVar2,a,0);
  *ppfVar6 = pfVar4;
  paVar1->arg = pfVar4->type;
  paVar2 = child(node,3);
  if (paVar2 != (ast *)0x0) {
    paVar5 = SEM_VarList(paVar2,f);
  }
  paVar1->next = paVar5;
  return paVar1;
}

Assistant:

static struct arg_t* SEM_VarList(struct ast *node, struct field_t **f) {
    struct arg_t *a = malloc(sizeof(struct arg_t));
    a->arg = SEM_ParamDec(child(node, 1), f);
    struct ast *child3 = child(node, 3);
    if (child3)
        a->next = SEM_VarList(child3, f);
    else
        a->next = NULL;
    return a;
}